

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O1

int __thiscall CPU::instrLDA0xa9(CPU *this)

{
  uint16_t addr;
  byte bVar1;
  
  addr = this->PC;
  this->PC = addr + 1;
  bVar1 = Memory::Read8(this->m,addr);
  this->A = bVar1;
  this->field_0x2e = bVar1 >> 7 | (bVar1 == 0) << 6 | this->field_0x2e & 0xbe;
  return 2;
}

Assistant:

int CPU::instrLDA0xa9() {
	LDA(immediate_addr());
	return 2;
}